

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O3

void __thiscall
MidiPlayerDialog::handlePlaybackTimeChanged
          (MidiPlayerDialog *this,quint64 currentNanos,quint32 totalSeconds)

{
  char cVar1;
  ulong uVar2;
  QByteArrayView QVar3;
  QString pos;
  QArrayData *local_c8 [3];
  QArrayData *local_b0 [3];
  QArrayData *local_98 [3];
  QArrayData *local_80 [3];
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  QVar3.m_data = (storage_type *)0xd;
  QVar3.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar3);
  local_68 = local_48;
  uStack_60 = uStack_40;
  local_58 = local_38;
  uVar2 = currentNanos / 1000000000 & 0xffffffff;
  QString::arg((ulonglong)local_c8,(int)&local_68,(int)(uVar2 / 0x3c),(QChar)0x2);
  QString::arg((ulonglong)local_b0,(int)local_c8,
               (int)(currentNanos / 1000000000) + (int)(uVar2 / 0x3c) * -0x3c,(QChar)0x2);
  QString::arg((ulonglong)local_98,(int)local_b0,totalSeconds / 0x3c,(QChar)0x2);
  QString::arg((ulonglong)local_80,(int)local_98,totalSeconds % 0x3c,(QChar)0x2);
  if (local_98[0] != (QArrayData *)0x0) {
    LOCK();
    (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98[0],2,8);
    }
  }
  if (local_b0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b0[0],2,8);
    }
  }
  if (local_c8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8[0],2,8);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  QLabel::setText(*(QString **)(this->ui + 0x68));
  cVar1 = QAbstractSlider::isSliderDown();
  if (cVar1 == '\0') {
    this->sliderUpdating = true;
    QAbstractSlider::setSliderPosition((int)*(undefined8 *)(this->ui + 0x70));
    this->sliderUpdating = false;
  }
  if (local_80[0] != (QArrayData *)0x0) {
    LOCK();
    (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_80[0],2,8);
    }
  }
  return;
}

Assistant:

void MidiPlayerDialog::handlePlaybackTimeChanged(quint64 currentNanos, quint32 totalSeconds) {
	quint32 currentSeconds = currentNanos / MasterClock::NANOS_PER_SECOND;
	QChar z = QChar('0');
	QString pos = QString("%1:%2 / %3:%4").arg(currentSeconds / 60, 2, 10, z).arg(currentSeconds % 60, 2, 10, z).arg(totalSeconds / 60, 2, 10, z).arg(totalSeconds % 60, 2, 10, z);
	ui->positionLabel->setText(pos);
	if (!ui->positionSlider->isSliderDown()) {
		sliderUpdating = true;
		ui->positionSlider->setSliderPosition((totalSeconds != 0) ? currentNanos / MasterClock::NANOS_PER_MILLISECOND / totalSeconds : 0);
		sliderUpdating = false;
	}
}